

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O1

void __thiscall
math::wide_integer::uintwide_t<64U,_unsigned_char,_void,_true>::uintwide_t<int>
          (uintwide_t<64U,_unsigned_char,_void,_true> *this,int v,
          enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value)> *p_nullparam)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  value_type_conflict4 *pvVar4;
  bool bVar5;
  array<unsigned_char,_8UL> local_10;
  
  *(undefined8 *)(this->values).super_array<unsigned_char,_8UL>.elems = 0;
  if (v < 0) {
    uVar3 = -v;
    local_10.elems[0] = '\0';
    local_10.elems[1] = '\0';
    local_10.elems[2] = '\0';
    local_10.elems[3] = '\0';
    local_10.elems[4] = '\0';
    local_10.elems[5] = '\0';
    local_10.elems[6] = '\0';
    local_10.elems[7] = '\0';
    lVar2 = -8;
    do {
      lVar1 = lVar2;
      (&stack0xfffffffffffffff8)[lVar1] = (char)uVar3;
      lVar2 = lVar1 + 1;
      if (uVar3 < 0x100) break;
      uVar3 = uVar3 >> 8;
    } while (lVar2 != 0);
    if (lVar2 != 0) {
      memset(&stack0xfffffffffffffff9 + lVar1,0,-lVar2);
    }
    *&(this->values).super_array<unsigned_char,_8UL>.elems = local_10.elems;
    lVar2 = 0;
    do {
      pvVar4 = (this->values).super_array<unsigned_char,_8UL>.elems + lVar2;
      *pvVar4 = ~*pvVar4;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 8);
    lVar2 = 0;
    do {
      pvVar4 = (this->values).super_array<unsigned_char,_8UL>.elems + lVar2;
      *pvVar4 = *pvVar4 + '\x01';
      if (*pvVar4 != '\0') {
        return;
      }
      bVar5 = lVar2 != 7;
      lVar2 = lVar2 + 1;
    } while (bVar5);
  }
  else {
    local_10.elems[0] = '\0';
    local_10.elems[1] = '\0';
    local_10.elems[2] = '\0';
    local_10.elems[3] = '\0';
    local_10.elems[4] = '\0';
    local_10.elems[5] = '\0';
    local_10.elems[6] = '\0';
    local_10.elems[7] = '\0';
    if (v == 0) {
      pvVar4 = local_10.elems;
      lVar2 = 0;
    }
    else {
      lVar2 = 0;
      do {
        lVar1 = lVar2;
        local_10.elems[lVar1] = (value_type_conflict4)v;
        lVar2 = lVar1 + 1;
        if ((uint)v < 0x100) break;
        v = (uint)v >> 8;
      } while (lVar1 != 7);
      pvVar4 = local_10.elems + lVar1 + 1;
    }
    if (lVar2 != 8) {
      memset(pvVar4,0,8 - lVar2);
    }
    *&(this->values).super_array<unsigned_char,_8UL>.elems = local_10.elems;
  }
  return;
}

Assistant:

constexpr uintwide_t(const SignedIntegralType v, // NOLINT(google-explicit-constructor,hicpp-explicit-conversions)
                         std::enable_if_t<(   std::is_integral<SignedIntegralType>::value
                                           && std::is_signed  <SignedIntegralType>::value)>* p_nullparam = nullptr)
      : values(number_of_limbs)
    {
      static_cast<void>(p_nullparam == nullptr);

      using local_signed_integral_type   = SignedIntegralType;
      using local_unsigned_integral_type =
        typename detail::uint_type_helper<static_cast<size_t>(std::numeric_limits<local_signed_integral_type>::digits + 1)>::exact_unsigned_type;

      const auto v_is_neg = (v < static_cast<local_signed_integral_type>(0));

      const local_unsigned_integral_type u =
        ((!v_is_neg) ? static_cast<local_unsigned_integral_type>(v)
                     : static_cast<local_unsigned_integral_type>(detail::negate(v)));

      operator=(uintwide_t(u));

      if(v_is_neg) { negate(); }
    }